

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O1

int agent_connfind(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*bv <= *av) {
    uVar1 = (uint)(*bv < *av);
  }
  return uVar1;
}

Assistant:

static int agent_connfind(void *av, void *bv)
{
    int afd = *(int *) av;
    agent_pending_query *b = (agent_pending_query *) bv;
    if (afd < b->fd)
        return -1;
    if (afd > b->fd)
        return +1;
    return 0;
}